

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

void cache_block(BGZF *fp,int size)

{
  kh_cache_t *h;
  khint64_t kVar1;
  khint32_t *pkVar2;
  cache_t *pcVar3;
  khint_t kVar4;
  int iVar5;
  khint_t kVar6;
  uint8_t *__dest;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  khint_t kVar10;
  khint_t kVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  
  if (fp->cache_size < 0x10001) {
    return;
  }
  h = (kh_cache_t *)fp->cache;
  if ((uint)fp->cache_size < h->size * 0x10000 + 0x10000) {
    uVar12 = h->n_buckets;
    bVar14 = uVar12 != 0;
    if (bVar14) {
      if ((*h->flags & 3) == 0) {
        uVar9 = 0;
      }
      else {
        bVar8 = 2;
        uVar13 = 1;
        do {
          uVar9 = uVar13;
          if (uVar12 == uVar9) goto LAB_0013e083;
          bVar7 = bVar8 & 0x1e;
          bVar8 = bVar8 + 2;
          uVar13 = uVar9 + 1;
        } while ((h->flags[uVar9 >> 4] >> bVar7 & 3) != 0);
        bVar14 = uVar9 < uVar12;
      }
      if ((bVar14) && (free(h->vals[uVar9].block), h->n_buckets != uVar9)) {
        uVar12 = h->flags[uVar9 >> 4];
        uVar13 = uVar9 * 2 & 0x1e;
        if ((uVar12 >> (sbyte)uVar13 & 3) == 0) {
          h->flags[uVar9 >> 4] = uVar12 | 1 << uVar13;
          h->size = h->size - 1;
        }
      }
    }
  }
LAB_0013e083:
  kVar1 = fp->block_address;
  if (h->n_occupied < h->upper_bound) {
LAB_0013e0b4:
    kVar10 = h->n_buckets;
    kVar6 = ((uint)(kVar1 >> 0x21) ^ (uint)kVar1 << 0xb ^ (uint)kVar1) & kVar10 - 1;
    pkVar2 = h->flags;
    if ((pkVar2[kVar6 >> 4] >> ((char)kVar6 * '\x02' & 0x1fU) & 2) == 0) {
      iVar5 = 1;
      uVar12 = kVar6;
      kVar11 = kVar10;
      do {
        uVar9 = uVar12 * 2 & 0x1e;
        uVar13 = pkVar2[uVar12 >> 4] >> (sbyte)uVar9;
        kVar4 = kVar10;
        if (((uVar13 & 2) != 0) || (((uVar13 & 1) == 0 && (h->keys[uVar12] == kVar1)))) break;
        if ((pkVar2[uVar12 >> 4] >> uVar9 & 1) != 0) {
          kVar11 = uVar12;
        }
        uVar12 = uVar12 + iVar5 & kVar10 - 1;
        iVar5 = iVar5 + 1;
        kVar4 = kVar11;
      } while (uVar12 != kVar6);
      kVar6 = kVar4;
      if (kVar4 == kVar10) {
        if (kVar11 == kVar10) {
          kVar11 = uVar12;
        }
        kVar6 = kVar11;
        if ((pkVar2[uVar12 >> 4] >> ((char)uVar12 * '\x02' & 0x1fU) & 2) == 0) {
          kVar6 = uVar12;
        }
      }
    }
    uVar9 = kVar6 >> 4;
    uVar12 = pkVar2[uVar9];
    bVar8 = (char)kVar6 * '\x02' & 0x1e;
    if ((uVar12 >> bVar8 & 2) == 0) {
      bVar14 = true;
      if ((uVar12 >> bVar8 & 1) == 0) goto LAB_0013e1da;
      h->keys[kVar6] = kVar1;
      pkVar2[uVar9] = uVar12 & ~(3 << bVar8);
      h->size = h->size + 1;
    }
    else {
      h->keys[kVar6] = kVar1;
      pkVar2[uVar9] = uVar12 & ~(3 << bVar8);
      h->size = h->size + 1;
      h->n_occupied = h->n_occupied + 1;
    }
  }
  else {
    uVar12 = h->n_buckets;
    if (h->size * 2 < uVar12) {
      kVar10 = uVar12 - 1;
    }
    else {
      kVar10 = uVar12 + 1;
    }
    iVar5 = kh_resize_cache(h,kVar10);
    if (-1 < iVar5) goto LAB_0013e0b4;
    kVar6 = h->n_buckets;
  }
  bVar14 = false;
LAB_0013e1da:
  if (bVar14) {
    return;
  }
  pcVar3 = h->vals;
  pcVar3[kVar6].size = fp->block_length;
  pcVar3[kVar6].end_offset = (long)size + fp->block_address;
  __dest = (uint8_t *)malloc(0x10000);
  pcVar3[kVar6].block = __dest;
  memcpy(__dest,fp->uncompressed_block,0x10000);
  return;
}

Assistant:

static void cache_block(BGZF *fp, int size)
{
    int ret;
    khint_t k;
    cache_t *p;
    khash_t(cache) *h = (khash_t(cache)*)fp->cache;
    if (BGZF_MAX_BLOCK_SIZE >= fp->cache_size) return;
    if ((kh_size(h) + 1) * BGZF_MAX_BLOCK_SIZE > (uint32_t)fp->cache_size) {
        /* A better way would be to remove the oldest block in the
         * cache, but here we remove a random one for simplicity. This
         * should not have a big impact on performance. */
        for (k = kh_begin(h); k < kh_end(h); ++k)
            if (kh_exist(h, k)) break;
        if (k < kh_end(h)) {
            free(kh_val(h, k).block);
            kh_del(cache, h, k);
        }
    }
    k = kh_put(cache, h, fp->block_address, &ret);
    if (ret == 0) return; // if this happens, a bug!
    p = &kh_val(h, k);
    p->size = fp->block_length;
    p->end_offset = fp->block_address + size;
    p->block = (uint8_t*)malloc(BGZF_MAX_BLOCK_SIZE);
    memcpy(kh_val(h, k).block, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
}